

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

Value __thiscall
flexbuffers::Builder::CreateVector
          (Builder *this,size_t start,size_t vec_len,size_t step,bool typed,bool fixed,Value *keys)

{
  ulong uVar1;
  size_t sVar2;
  Type TVar3;
  BitWidth *pBVar4;
  size_type_conflict sVar5;
  reference pvVar6;
  Type local_fc;
  size_t local_f8;
  Type local_ec;
  bool local_cd;
  char local_7a;
  uint8_t local_79;
  ulong local_78;
  size_t i_2;
  size_t i_1;
  size_type_conflict vloc;
  uint8_t byte_width;
  ulong uStack_58;
  BitWidth elem_width;
  size_t i;
  Type vector_type;
  BitWidth local_44;
  int prefix_elems;
  byte local_3a;
  byte local_39;
  BitWidth bit_width;
  bool fixed_local;
  bool typed_local;
  size_t step_local;
  size_t vec_len_local;
  size_t start_local;
  Builder *this_local;
  
  local_7a = '\x01';
  if (fixed) {
    local_7a = typed;
  }
  local_3a = fixed;
  local_39 = typed;
  _bit_width = step;
  step_local = vec_len;
  vec_len_local = start;
  start_local = (size_t)this;
  if (local_7a == '\0') {
    __assert_fail("!fixed || typed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                  ,0x64a,
                  "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                 );
  }
  local_44 = WidthU(vec_len);
  pBVar4 = std::max<flexbuffers::BitWidth>(&this->force_min_bit_width_,&local_44);
  prefix_elems = *pBVar4;
  vector_type = FBT_INT;
  if (keys != (Value *)0x0) {
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
    i._4_4_ = Value::ElemWidth(keys,sVar5,0);
    pBVar4 = std::max<flexbuffers::BitWidth>((BitWidth *)&prefix_elems,(BitWidth *)((long)&i + 4));
    prefix_elems = *pBVar4;
    vector_type = vector_type + FBT_UINT;
  }
  i._0_4_ = FBT_KEY;
  for (uStack_58 = vec_len_local; uVar1 = uStack_58,
      sVar5 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
              ::size(&this->stack_), uVar1 < sVar5; uStack_58 = _bit_width + uStack_58) {
    pvVar6 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::operator[](&this->stack_,uStack_58);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
    vloc._4_4_ = Value::ElemWidth(pvVar6,sVar5,(uStack_58 - vec_len_local) + (long)(int)vector_type)
    ;
    pBVar4 = std::max<flexbuffers::BitWidth>
                       ((BitWidth *)&prefix_elems,(BitWidth *)((long)&vloc + 4));
    TVar3 = (Type)i;
    prefix_elems = *pBVar4;
    if ((local_39 & 1) != 0) {
      if (uStack_58 == vec_len_local) {
        pvVar6 = std::
                 vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
                 operator[](&this->stack_,uStack_58);
        i._0_4_ = pvVar6->type_;
      }
      else {
        pvVar6 = std::
                 vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
                 operator[](&this->stack_,uStack_58);
        if (TVar3 != pvVar6->type_) {
          __assert_fail("vector_type == stack_[i].type_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                        ,0x660,
                        "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
                       );
        }
      }
    }
  }
  local_cd = true;
  if ((local_39 & 1) != 0) {
    local_cd = IsTypedVectorElementType((Type)i);
  }
  if (local_cd != false) {
    vloc._3_1_ = Align(this,prefix_elems);
    if (keys != (Value *)0x0) {
      WriteOffset(this,(keys->field_0).u_,vloc._3_1_);
      Write<unsigned_long>(this,1L << ((byte)keys->min_bit_width_ & 0x3f),(ulong)vloc._3_1_);
    }
    if ((local_3a & 1) == 0) {
      Write<unsigned_long>(this,step_local,(ulong)vloc._3_1_);
    }
    i_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
    for (i_2 = vec_len_local; sVar2 = i_2,
        sVar5 = std::
                vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
                size(&this->stack_), sVar2 < sVar5; i_2 = _bit_width + i_2) {
      pvVar6 = std::
               vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
               operator[](&this->stack_,i_2);
      WriteAny(this,pvVar6,vloc._3_1_);
    }
    if ((local_39 & 1) == 0) {
      for (local_78 = vec_len_local; uVar1 = local_78,
          sVar5 = std::
                  vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ::size(&this->stack_), uVar1 < sVar5; local_78 = _bit_width + local_78) {
        pvVar6 = std::
                 vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
                 operator[](&this->stack_,local_78);
        local_79 = Value::StoredPackedType(pvVar6,prefix_elems);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->buf_,&local_79)
        ;
      }
    }
    sVar2 = i_1;
    if (keys == (Value *)0x0) {
      if ((local_39 & 1) == 0) {
        local_fc = FBT_VECTOR;
      }
      else {
        if ((local_3a & 1) == 0) {
          local_f8 = 0;
        }
        else {
          local_f8 = step_local;
        }
        local_fc = ToTypedVector((Type)i,local_f8);
      }
      local_ec = local_fc;
    }
    else {
      local_ec = FBT_MAP;
    }
    Value::Value((Value *)&this_local,sVar2,local_ec,prefix_elems);
    return _this_local;
  }
  __assert_fail("!typed || IsTypedVectorElementType(vector_type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x666,
                "Value flexbuffers::Builder::CreateVector(size_t, size_t, size_t, bool, bool, const Value *)"
               );
}

Assistant:

Value CreateVector(size_t start, size_t vec_len, size_t step, bool typed,
                     bool fixed, const Value *keys = nullptr) {
    FLATBUFFERS_ASSERT(
        !fixed ||
        typed);  // typed=false, fixed=true combination is not supported.
    // Figure out smallest bit width we can store this vector with.
    auto bit_width = (std::max)(force_min_bit_width_, WidthU(vec_len));
    auto prefix_elems = 1;
    if (keys) {
      // If this vector is part of a map, we will pre-fix an offset to the keys
      // to this vector.
      bit_width = (std::max)(bit_width, keys->ElemWidth(buf_.size(), 0));
      prefix_elems += 2;
    }
    Type vector_type = FBT_KEY;
    // Check bit widths and types for all elements.
    for (size_t i = start; i < stack_.size(); i += step) {
      auto elem_width =
          stack_[i].ElemWidth(buf_.size(), i - start + prefix_elems);
      bit_width = (std::max)(bit_width, elem_width);
      if (typed) {
        if (i == start) {
          vector_type = stack_[i].type_;
        } else {
          // If you get this assert, you are writing a typed vector with
          // elements that are not all the same type.
          FLATBUFFERS_ASSERT(vector_type == stack_[i].type_);
        }
      }
    }
    // If you get this assert, your typed types are not one of:
    // Int / UInt / Float / Key.
    FLATBUFFERS_ASSERT(!typed || IsTypedVectorElementType(vector_type));
    auto byte_width = Align(bit_width);
    // Write vector. First the keys width/offset if available, and size.
    if (keys) {
      WriteOffset(keys->u_, byte_width);
      Write<uint64_t>(1ULL << keys->min_bit_width_, byte_width);
    }
    if (!fixed) Write<uint64_t>(vec_len, byte_width);
    // Then the actual data.
    auto vloc = buf_.size();
    for (size_t i = start; i < stack_.size(); i += step) {
      WriteAny(stack_[i], byte_width);
    }
    // Then the types.
    if (!typed) {
      for (size_t i = start; i < stack_.size(); i += step) {
        buf_.push_back(stack_[i].StoredPackedType(bit_width));
      }
    }
    return Value(static_cast<uint64_t>(vloc),
                 keys ? FBT_MAP
                      : (typed ? ToTypedVector(vector_type, fixed ? vec_len : 0)
                               : FBT_VECTOR),
                 bit_width);
  }